

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265d_parser.c
# Opt level: O3

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s,RK_U8 *src,int length,HEVCNAL *nal)

{
  RK_U8 RVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  RK_U8 *pRVar7;
  
  s->skipped_bytes = 0;
  iVar4 = length;
  if (1 < length) {
    iVar3 = 0;
    do {
      uVar2 = *(uint *)(src + iVar3);
      iVar5 = iVar3;
      if ((~(0x1000100 - uVar2 | uVar2) & 0x80008080) != 0) {
        uVar6 = (ulong)(iVar3 - (uint)((char)uVar2 == '\0'));
        if (iVar3 < 1) {
          uVar6 = (long)iVar3;
        }
        pRVar7 = src + uVar6;
        iVar4 = (int)uVar6 + -1;
        do {
          iVar5 = iVar4;
          iVar4 = iVar5 + 1;
          RVar1 = *pRVar7;
          pRVar7 = pRVar7 + 1;
        } while (RVar1 != '\0');
        if (((iVar5 + 3 < length) && (*pRVar7 == '\0')) && (src[iVar5 + 3] < 2)) break;
        iVar5 = iVar5 + -2;
      }
      iVar3 = iVar5 + 5;
      iVar4 = length;
    } while (iVar5 + 6 < length);
  }
  iVar3 = iVar4 + 8;
  pRVar7 = nal->rbsp_buffer;
  if (nal->rbsp_buffer_size < iVar3) {
    mpp_osal_free("mpp_hevc_extract_rbsp",pRVar7);
    nal->rbsp_buffer = (RK_U8 *)0x0;
    iVar5 = iVar3 * 0x11 + 0xf;
    if (-1 < iVar3 * 0x11) {
      iVar5 = iVar3 * 0x11;
    }
    iVar5 = (iVar5 >> 4) + 0x20;
    if (iVar5 <= iVar3) {
      iVar5 = iVar3;
    }
    pRVar7 = (RK_U8 *)mpp_osal_malloc("mpp_hevc_extract_rbsp",(long)iVar5);
    nal->rbsp_buffer = pRVar7;
    if (pRVar7 == (RK_U8 *)0x0) {
      iVar5 = 0;
    }
    nal->rbsp_buffer_size = iVar5;
  }
  memcpy(pRVar7,src,(long)iVar4);
  nal->data = nal->rbsp_buffer;
  nal->size = iVar4;
  pRVar7 = nal->rbsp_buffer + iVar4;
  pRVar7[0] = '\0';
  pRVar7[1] = '\0';
  pRVar7[2] = '\0';
  pRVar7[3] = '\0';
  pRVar7[4] = '\0';
  pRVar7[5] = '\0';
  pRVar7[6] = '\0';
  pRVar7[7] = '\0';
  return iVar4;
}

Assistant:

RK_S32 mpp_hevc_extract_rbsp(HEVCContext *s, const RK_U8 *src, int length,
                             HEVCNAL *nal)
{
    RK_S32 i;

    s->skipped_bytes = 0;

#define STARTCODE_TEST                                              \
    if (i + 2 < length && src[i + 1] == 0 && src[i + 2] < 2) {      \
            /* startcode, so we must be past the end */             \
        length = i;                                                 \
        break;                                                      \
    }